

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

Kit_DsdObj_t * Kit_DsdObjAlloc(Kit_DsdNtk_t *pNtk,Kit_Dsd_t Type,int nFans)

{
  ushort uVar1;
  Kit_DsdObj_t *__s;
  Kit_DsdObj_t **ppKVar2;
  int iVar3;
  ulong __size;
  size_t __size_00;
  uint uVar4;
  
  uVar4 = (nFans & 1U) + (nFans >> 1);
  iVar3 = 1 << ((char)nFans - 5U & 0x1f);
  if (nFans < 6) {
    iVar3 = 1;
  }
  if (Type != KIT_DSD_PRIME) {
    iVar3 = 0;
  }
  __size_00 = (size_t)(int)((iVar3 + uVar4) * 4 + 4);
  __s = (Kit_DsdObj_t *)malloc(__size_00);
  memset(__s,0,__size_00);
  iVar3 = *(int *)&pNtk->nNodes;
  *__s = (Kit_DsdObj_t)
         ((uVar4 & 0xff) << 10 | nFans << 0x1a | (Type & (KIT_DSD_XOR|KIT_DSD_AND)) << 6 |
          (uint)*__s & 0x3fc0200 | iVar3 + *(int *)pNtk & 0x3fU);
  uVar1 = pNtk->nNodesAlloc;
  if ((ushort)iVar3 == uVar1) {
    pNtk->nNodesAlloc = uVar1 * 2;
    __size = (ulong)((uVar1 & 0x7fff) << 4);
    if (pNtk->pNodes == (Kit_DsdObj_t **)0x0) {
      ppKVar2 = (Kit_DsdObj_t **)malloc(__size);
    }
    else {
      ppKVar2 = (Kit_DsdObj_t **)realloc(pNtk->pNodes,__size);
    }
    pNtk->pNodes = ppKVar2;
  }
  uVar1 = pNtk->nNodes;
  if (uVar1 < pNtk->nNodesAlloc) {
    pNtk->nNodes = uVar1 + 1;
    pNtk->pNodes[uVar1] = __s;
    return __s;
  }
  __assert_fail("pNtk->nNodes < pNtk->nNodesAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                ,0x6d,"Kit_DsdObj_t *Kit_DsdObjAlloc(Kit_DsdNtk_t *, Kit_Dsd_t, int)");
}

Assistant:

Kit_DsdObj_t * Kit_DsdObjAlloc( Kit_DsdNtk_t * pNtk, Kit_Dsd_t Type, int nFans )
{
    Kit_DsdObj_t * pObj;
    int nSize = sizeof(Kit_DsdObj_t) + sizeof(unsigned) * (Kit_DsdObjOffset(nFans) + (Type == KIT_DSD_PRIME) * Kit_TruthWordNum(nFans));
    pObj = (Kit_DsdObj_t *)ABC_ALLOC( char, nSize );
    memset( pObj, 0, (size_t)nSize );
    pObj->Id = pNtk->nVars + pNtk->nNodes;
    pObj->Type = Type;
    pObj->nFans = nFans;
    pObj->Offset = Kit_DsdObjOffset( nFans );
    // add the object
    if ( pNtk->nNodes == pNtk->nNodesAlloc )
    {
        pNtk->nNodesAlloc *= 2;
        pNtk->pNodes = ABC_REALLOC( Kit_DsdObj_t *, pNtk->pNodes, pNtk->nNodesAlloc ); 
    }
    assert( pNtk->nNodes < pNtk->nNodesAlloc );
    pNtk->pNodes[pNtk->nNodes++] = pObj;
    return pObj;
}